

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CubicLattice.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::CubicLattice::getLatticeConstant
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,CubicLattice *this)

{
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::push_back
            (__return_storage_ptr__,(value_type_conflict1 *)&(this->super_Lattice).cellLen);
  return __return_storage_ptr__;
}

Assistant:

std::vector<RealType> CubicLattice::getLatticeConstant() {
    std::vector<RealType> lc;

    lc.push_back(cellLen.x());
    return lc;
  }